

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeView::selectionChanged(QTreeView *this,QItemSelection *selected,QItemSelection *deselected)

{
  bool bVar1;
  int chld;
  ulong uVar2;
  QItemSelection *in_RDX;
  QItemSelection *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  int entry_1;
  int entry;
  QTreeViewPrivate *d;
  QModelIndex desel;
  QModelIndex sel;
  QAccessibleEvent event_1;
  QAccessibleEvent event;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QObject *this_00;
  QModelIndex *in_stack_ffffffffffffff58;
  QTreeViewPrivate *in_stack_ffffffffffffff60;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QAbstractItemView::selectionChanged((QAbstractItemView *)in_RDI,in_RSI,in_RDX);
  uVar2 = QAccessible::isActive();
  if ((uVar2 & 1) != 0) {
    d_func((QTreeView *)0x90117a);
    QItemSelection::indexes();
    QList<QModelIndex>::value((QList<QModelIndex> *)this_00,(qsizetype)in_RSI);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x9011d5);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
    if (bVar1) {
      in_stack_ffffffffffffff34 =
           QTreeViewPrivate::accessibleTree2Index
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_28,in_RDI,SelectionAdd);
      QAccessibleEvent::setChild((QAccessibleEvent *)&local_28,in_stack_ffffffffffffff34);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
    }
    QItemSelection::indexes();
    QList<QModelIndex>::value((QList<QModelIndex> *)this_00,(qsizetype)in_RSI);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x9012c8);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
    ;
    if (bVar1) {
      chld = QTreeViewPrivate::accessibleTree2Index
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_48,in_RDI,SelectionRemove);
      QAccessibleEvent::setChild((QAccessibleEvent *)&local_48,chld);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::selectionChanged(const QItemSelection &selected,
                                 const QItemSelection &deselected)
{
    QAbstractItemView::selectionChanged(selected, deselected);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        Q_D(QTreeView);

        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = d->accessibleTree2Index(sel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = d->accessibleTree2Index(desel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}